

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseOption
          (Parser *this,Message *options,LocationRecorder *options_location,
          FileDescriptorProto *containing_file,OptionStyle style)

{
  ErrorCollector *pEVar1;
  undefined8 source_code_info;
  _Alloc_hider _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int path2;
  undefined4 extraout_var;
  FieldDescriptor *field;
  LogMessage *pLVar6;
  UninterpretedOption *uninterpreted_option;
  string *value;
  Parser *pPVar7;
  FileDescriptorProto *containing_file_00;
  long lVar8;
  uint uVar9;
  Reflection *this_00;
  Reflection *this_01;
  LocationRecorder *pLVar10;
  LocationRecorder name_location;
  LocationRecorder part_location;
  LocationRecorder location;
  LogFinisher local_e1;
  undefined1 local_e0 [16];
  undefined1 local_d0 [72];
  _Alloc_hider local_88;
  undefined1 local_80 [24];
  LogMessage local_68;
  
  local_d0._68_4_ = style;
  local_88._M_p = (pointer)this;
  iVar5 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  local_68._0_8_ = (long)&local_68 + 0x10U;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"uninterpreted_option","");
  field = Descriptor::FindFieldByName
                    ((Descriptor *)CONCAT44(extraout_var,iVar5),(string *)&local_68);
  if (local_68._0_8_ != (long)&local_68 + 0x10U) {
    operator_delete((void *)local_68._0_8_);
  }
  if (field == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x58e);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: uninterpreted_option_field != NULL: ");
    pLVar6 = internal::LogMessage::operator<<
                       (pLVar6,"No field named \"uninterpreted_option\" in the Options proto.");
    internal::LogFinisher::operator=((LogFinisher *)local_e0,pLVar6);
    internal::LogMessage::~LogMessage(&local_68);
  }
  (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  iVar5 = *(int *)(field + 0x44);
  path2 = Reflection::FieldSize(this_00,options,field);
  LocationRecorder::LocationRecorder((LocationRecorder *)local_80,options_location,iVar5,path2);
  _Var2._M_p = local_88._M_p;
  if ((local_d0._68_4_ != OPTION_STATEMENT) ||
     (bVar3 = Consume((Parser *)local_88._M_p,"option"), bVar3)) {
    (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
    containing_file_00 = (FileDescriptorProto *)0x0;
    uninterpreted_option =
         (UninterpretedOption *)Reflection::AddMessage(this_01,options,field,(MessageFactory *)0x0);
    LocationRecorder::Init
              ((LocationRecorder *)local_e0,(LocationRecorder *)local_80,
               (SourceCodeInfo *)local_80._8_8_);
    LocationRecorder::AddPath((LocationRecorder *)local_e0,2);
    LocationRecorder::RecordLegacyLocation
              ((LocationRecorder *)local_e0,(Message *)uninterpreted_option,OPTION_NAME);
    source_code_info = local_e0._8_8_;
    iVar5 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
    LocationRecorder::Init
              ((LocationRecorder *)(local_d0 + 0x28),(LocationRecorder *)local_e0,
               (SourceCodeInfo *)local_e0._8_8_);
    LocationRecorder::AddPath((LocationRecorder *)(local_d0 + 0x28),iVar5);
    bVar3 = ParseOptionNamePart((Parser *)_Var2._M_p,uninterpreted_option,
                                (LocationRecorder *)(local_d0 + 0x28),containing_file_00);
    LocationRecorder::~LocationRecorder((LocationRecorder *)(local_d0 + 0x28));
    if (bVar3) {
      pLVar10 = (LocationRecorder *)(local_d0 + 0x28);
LAB_0030ecbb:
      _Var2._M_p = local_88._M_p;
      iVar5 = std::__cxx11::string::compare((char *)(*(long *)local_88._M_p + 8));
      if (iVar5 != 0) {
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_e0);
        bVar3 = Consume((Parser *)_Var2._M_p,"=");
        if (!bVar3) goto LAB_0030ed26;
        LocationRecorder::Init
                  ((LocationRecorder *)(local_d0 + 0x28),(LocationRecorder *)local_80,
                   (SourceCodeInfo *)local_80._8_8_);
        LocationRecorder::RecordLegacyLocation
                  ((LocationRecorder *)(local_d0 + 0x28),(Message *)uninterpreted_option,
                   OPTION_VALUE);
        bVar3 = TryConsume((Parser *)_Var2._M_p,"-");
        switch(**(undefined4 **)_Var2._M_p) {
        case 0:
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_e0,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
                     ,0x5c3);
          pLVar6 = internal::LogMessage::operator<<
                             ((LogMessage *)local_e0,
                              "Trying to read value before any tokens have been read.");
          internal::LogFinisher::operator=(&local_e1,pLVar6);
          internal::LogMessage::~LogMessage((LogMessage *)local_e0);
          break;
        case 1:
          local_e0._0_8_ = local_d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e0,"Unexpected end of stream while parsing option value.","");
          pEVar1 = *(ErrorCollector **)(_Var2._M_p + 8);
          if (pEVar1 != (ErrorCollector *)0x0) {
            (*pEVar1->_vptr_ErrorCollector[2])
                      (pEVar1,(ulong)*(uint *)(*(long *)_Var2._M_p + 0x28),
                       (ulong)*(uint *)(*(long *)_Var2._M_p + 0x2c),local_e0);
          }
          goto LAB_0030effa;
        case 2:
          LocationRecorder::AddPath((LocationRecorder *)(local_d0 + 0x28),3);
          if (bVar3) {
            local_e0._0_8_ = local_d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e0,"Invalid \'-\' symbol before identifier.","");
            pEVar1 = *(ErrorCollector **)(_Var2._M_p + 8);
            if (pEVar1 != (ErrorCollector *)0x0) {
              (*pEVar1->_vptr_ErrorCollector[2])
                        (pEVar1,(ulong)*(uint *)(*(long *)_Var2._M_p + 0x28),
                         (ulong)*(uint *)(*(long *)_Var2._M_p + 0x2c),local_e0);
            }
            goto LAB_0030effa;
          }
          local_e0._0_8_ = local_d0;
          local_e0._8_8_ = (SourceCodeInfo *)0x0;
          local_d0[0] = '\0';
          bVar4 = ConsumeIdentifier((Parser *)_Var2._M_p,(string *)local_e0,"Expected identifier.");
          if (bVar4) {
            UninterpretedOption::set_identifier_value(uninterpreted_option,(string *)local_e0);
LAB_0030f090:
            if ((Parser *)local_e0._0_8_ != (Parser *)local_d0) {
              operator_delete((void *)local_e0._0_8_);
            }
            goto LAB_0030f107;
          }
LAB_0030f0a1:
          if ((Parser *)local_e0._0_8_ == (Parser *)local_d0) break;
          goto LAB_0030f00c;
        case 3:
          bVar4 = ConsumeInteger64((Parser *)_Var2._M_p,(ulong)bVar3 - 1 | 0x8000000000000000,
                                   (uint64 *)local_e0,"Expected integer.");
          if (bVar4) {
            if (bVar3) {
              LocationRecorder::AddPath((LocationRecorder *)(local_d0 + 0x28),5);
              lVar8 = 0x50;
              uVar9 = 0x10;
              pPVar7 = (Parser *)-local_e0._0_8_;
            }
            else {
              LocationRecorder::AddPath((LocationRecorder *)(local_d0 + 0x28),4);
              lVar8 = 0x48;
              uVar9 = 8;
              pPVar7 = (Parser *)local_e0._0_8_;
            }
            (uninterpreted_option->_has_bits_).has_bits_[0] =
                 (uninterpreted_option->_has_bits_).has_bits_[0] | uVar9;
            *(Parser **)
             ((long)&(((UninterpretedOption *)(&uninterpreted_option->_has_bits_ + -4))->
                     super_Message).super_MessageLite._vptr_MessageLite + lVar8) = pPVar7;
LAB_0030f107:
            if (bVar4 != false) goto switchD_0030edb7_default;
          }
          break;
        case 4:
          LocationRecorder::AddPath((LocationRecorder *)(local_d0 + 0x28),6);
          bVar4 = ConsumeNumber((Parser *)_Var2._M_p,(double *)local_e0,"Expected number.");
          if (bVar4) {
            pPVar7 = (Parser *)local_e0._0_8_;
            if (bVar3) {
              pPVar7 = (Parser *)(local_e0._0_8_ ^ 0x8000000000000000);
            }
            (uninterpreted_option->_has_bits_).has_bits_[0] =
                 (uninterpreted_option->_has_bits_).has_bits_[0] | 0x20;
            uninterpreted_option->double_value_ = (double)pPVar7;
            goto switchD_0030edb7_default;
          }
          break;
        case 5:
          LocationRecorder::AddPath((LocationRecorder *)(local_d0 + 0x28),7);
          if (!bVar3) {
            local_e0._0_8_ = local_d0;
            local_e0._8_8_ = (SourceCodeInfo *)0x0;
            local_d0[0] = '\0';
            bVar4 = ConsumeString((Parser *)_Var2._M_p,(string *)local_e0,"Expected string.");
            if (bVar4) {
              UninterpretedOption::set_string_value(uninterpreted_option,(string *)local_e0);
              goto LAB_0030f090;
            }
            goto LAB_0030f0a1;
          }
          local_e0._0_8_ = local_d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e0,"Invalid \'-\' symbol before string.","");
          pEVar1 = *(ErrorCollector **)(_Var2._M_p + 8);
          if (pEVar1 != (ErrorCollector *)0x0) {
            (*pEVar1->_vptr_ErrorCollector[2])
                      (pEVar1,(ulong)*(uint *)(*(long *)_Var2._M_p + 0x28),
                       (ulong)*(uint *)(*(long *)_Var2._M_p + 0x2c),local_e0);
          }
LAB_0030effa:
          _Var2._M_p[0x20] = true;
          if ((Parser *)local_e0._0_8_ != (Parser *)local_d0) {
LAB_0030f00c:
            operator_delete((void *)local_e0._0_8_);
          }
          break;
        case 6:
          iVar5 = std::__cxx11::string::compare((char *)(*(undefined4 **)_Var2._M_p + 2));
          if (iVar5 != 0) {
            local_e0._0_8_ = local_d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e0,"Expected option value.","");
            pEVar1 = *(ErrorCollector **)(_Var2._M_p + 8);
            if (pEVar1 != (ErrorCollector *)0x0) {
              (*pEVar1->_vptr_ErrorCollector[2])
                        (pEVar1,(ulong)*(uint *)(*(long *)_Var2._M_p + 0x28),
                         (ulong)*(uint *)(*(long *)_Var2._M_p + 0x2c),local_e0);
            }
            goto LAB_0030effa;
          }
          LocationRecorder::AddPath((LocationRecorder *)(local_d0 + 0x28),8);
          value = UninterpretedOption::mutable_aggregate_value_abi_cxx11_(uninterpreted_option);
          bVar3 = ParseUninterpretedBlock((Parser *)_Var2._M_p,value);
          if (bVar3) goto switchD_0030edb7_default;
          break;
        default:
switchD_0030edb7_default:
          LocationRecorder::~LocationRecorder((LocationRecorder *)(local_d0 + 0x28));
          if ((local_d0._68_4_ == OPTION_STATEMENT) &&
             (bVar3 = ConsumeEndOfDeclaration((Parser *)_Var2._M_p,";",(LocationRecorder *)local_80)
             , !bVar3)) goto LAB_0030ed26;
          bVar3 = true;
          goto LAB_0030ed28;
        }
        pLVar10 = (LocationRecorder *)(local_d0 + 0x28);
        goto LAB_0030ed21;
      }
      bVar3 = Consume((Parser *)_Var2._M_p,".");
      if (bVar3) goto code_r0x0030ece2;
    }
LAB_0030ed1c:
    pLVar10 = (LocationRecorder *)local_e0;
LAB_0030ed21:
    LocationRecorder::~LocationRecorder(pLVar10);
  }
LAB_0030ed26:
  bVar3 = false;
LAB_0030ed28:
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_80);
  return bVar3;
code_r0x0030ece2:
  iVar5 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
  LocationRecorder::Init(pLVar10,(LocationRecorder *)local_e0,(SourceCodeInfo *)source_code_info);
  LocationRecorder::AddPath(pLVar10,iVar5);
  bVar3 = ParseOptionNamePart((Parser *)local_88._M_p,uninterpreted_option,pLVar10,
                              containing_file_00);
  LocationRecorder::~LocationRecorder(pLVar10);
  if (!bVar3) goto LAB_0030ed1c;
  goto LAB_0030ecbb;
}

Assistant:

bool Parser::ParseOption(Message* options,
                         const LocationRecorder& options_location,
                         const FileDescriptorProto* containing_file,
                         OptionStyle style) {
  // Create an entry in the uninterpreted_option field.
  const FieldDescriptor* uninterpreted_option_field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(uninterpreted_option_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const Reflection* reflection = options->GetReflection();

  LocationRecorder location(
      options_location, uninterpreted_option_field->number(),
      reflection->FieldSize(*options, uninterpreted_option_field));

  if (style == OPTION_STATEMENT) {
    DO(Consume("option"));
  }

  UninterpretedOption* uninterpreted_option =
      down_cast<UninterpretedOption*>(options->GetReflection()->AddMessage(
          options, uninterpreted_option_field));

  // Parse dot-separated name.
  {
    LocationRecorder name_location(location,
                                   UninterpretedOption::kNameFieldNumber);
    name_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_NAME);

    {
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }

    while (LookingAt(".")) {
      DO(Consume("."));
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }
  }

  DO(Consume("="));

  {
    LocationRecorder value_location(location);
    value_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_VALUE);

    // All values are a single token, except for negative numbers, which consist
    // of a single '-' symbol, followed by a positive number.
    bool is_negative = TryConsume("-");

    switch (input_->current().type) {
      case io::Tokenizer::TYPE_START:
        GOOGLE_LOG(FATAL) << "Trying to read value before any tokens have been read.";
        return false;

      case io::Tokenizer::TYPE_END:
        AddError("Unexpected end of stream while parsing option value.");
        return false;

      case io::Tokenizer::TYPE_IDENTIFIER: {
        value_location.AddPath(
            UninterpretedOption::kIdentifierValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before identifier.");
          return false;
        }
        std::string value;
        DO(ConsumeIdentifier(&value, "Expected identifier."));
        uninterpreted_option->set_identifier_value(value);
        break;
      }

      case io::Tokenizer::TYPE_INTEGER: {
        uint64 value;
        uint64 max_value =
            is_negative ? static_cast<uint64>(kint64max) + 1 : kuint64max;
        DO(ConsumeInteger64(max_value, &value, "Expected integer."));
        if (is_negative) {
          value_location.AddPath(
              UninterpretedOption::kNegativeIntValueFieldNumber);
          uninterpreted_option->set_negative_int_value(
              static_cast<int64>(-value));
        } else {
          value_location.AddPath(
              UninterpretedOption::kPositiveIntValueFieldNumber);
          uninterpreted_option->set_positive_int_value(value);
        }
        break;
      }

      case io::Tokenizer::TYPE_FLOAT: {
        value_location.AddPath(UninterpretedOption::kDoubleValueFieldNumber);
        double value;
        DO(ConsumeNumber(&value, "Expected number."));
        uninterpreted_option->set_double_value(is_negative ? -value : value);
        break;
      }

      case io::Tokenizer::TYPE_STRING: {
        value_location.AddPath(UninterpretedOption::kStringValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before string.");
          return false;
        }
        std::string value;
        DO(ConsumeString(&value, "Expected string."));
        uninterpreted_option->set_string_value(value);
        break;
      }

      case io::Tokenizer::TYPE_SYMBOL:
        if (LookingAt("{")) {
          value_location.AddPath(
              UninterpretedOption::kAggregateValueFieldNumber);
          DO(ParseUninterpretedBlock(
              uninterpreted_option->mutable_aggregate_value()));
        } else {
          AddError("Expected option value.");
          return false;
        }
        break;
    }
  }

  if (style == OPTION_STATEMENT) {
    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}